

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_models.c
# Opt level: O3

void s390_init_cpu_model(uc_struct *uc,uc_cpu_s390x cpu_model)

{
  CPUState *pCVar1;
  CPUClass *pCVar2;
  void *pvVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  unsigned_long uVar6;
  undefined8 uVar7;
  unsigned_long uVar8;
  undefined8 uVar9;
  long lVar10;
  TranslationBlock *pTVar11;
  TranslationBlock *pTVar12;
  S390CPUClass *xcc;
  tb_tc *ptVar13;
  S390CPU *cpu;
  undefined4 uVar14;
  uint32_t uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  
  lVar10 = 0;
  do {
    ignored_base_feat[(ulong)(long)*(int *)((long)&init_ignored_base_feat_feats + lVar10) >> 6] =
         ignored_base_feat[(ulong)(long)*(int *)((long)&init_ignored_base_feat_feats + lVar10) >> 6]
         | 1L << ((byte)*(int *)((long)&init_ignored_base_feat_feats + lVar10) & 0x3f);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x30);
  s390_init_feat_bitmap(qemu_max_cpu_feat_init,qemu_max_cpu_feat);
  lVar10 = 0;
  do {
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].base_init + lVar10),
               (unsigned_long *)((long)s390_cpu_defs[0].base_feat + lVar10));
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].default_init + lVar10),
               (unsigned_long *)((long)s390_cpu_defs[0].default_feat + lVar10));
    s390_init_feat_bitmap
              ((uint64_t *)((long)s390_cpu_defs[0].full_init + lVar10),
               (unsigned_long *)((long)s390_cpu_defs[0].full_feat + lVar10));
    lVar10 = lVar10 + 0x110;
  } while (lVar10 != 0x2640);
  s390_set_qemu_cpu_model(0x2964,'\r','\x02',s390_init_cpu_model::qemu_latest_init);
  if (cpu_model < UC_CPU_S390X_QEMU) {
    pCVar1 = uc->cpu;
    pCVar2 = pCVar1->cc;
    *(undefined1 *)&pCVar2[1].has_work = 1;
    pCVar2[1].reset = (_func_void_CPUState_ptr_conflict *)(s390_cpu_defs + cpu_model);
    pTVar11 = (TranslationBlock *)g_malloc0(0x40);
    pCVar1[1].tb_jmp_cache[0x1db] = pTVar11;
    pTVar12 = pCVar1[1].tb_jmp_cache[0x1f1];
    pTVar11->pc = (target_ulong)pTVar12;
    ptVar13 = &pTVar12->tc;
    if (*(char *)(pCVar1[1].tb_jmp_cache + 0x1f2) == '\0') {
      ptVar13 = (tb_tc *)&pTVar12->jmp_list_head;
    }
    uVar14 = *(undefined4 *)&ptVar13->size;
    uVar4 = *(undefined2 *)((long)&ptVar13->size + 4);
    uVar5 = *(undefined2 *)((long)&ptVar13->size + 6);
    pTVar12 = *(TranslationBlock **)(ptVar13 + 1);
    pvVar3 = *(void **)((long)(ptVar13 + 1) + 8);
    pTVar11->cs_base = (target_ulong)ptVar13->ptr;
    pTVar11->flags = uVar14;
    pTVar11->size = uVar4;
    pTVar11->icount = uVar5;
    *(TranslationBlock **)&pTVar11->cflags = pTVar12;
    (pTVar11->tc).ptr = pvVar3;
    (pTVar11->tc).size = *(size_t *)(ptVar13 + 2);
  }
  else {
    if (cpu_model == UC_CPU_S390X_QEMU) {
      pCVar1 = uc->cpu;
      pTVar12 = (TranslationBlock *)g_malloc0(0x40);
      pCVar1[1].tb_jmp_cache[0x1db] = pTVar12;
      uVar6 = s390_qemu_cpu_model.features[0];
      pTVar12->pc = (target_ulong)s390_qemu_cpu_model.def;
      pTVar12->cs_base = uVar6;
      uVar6 = s390_qemu_cpu_model.features[2];
      uVar4 = s390_qemu_cpu_model.features[1]._4_2_;
      uVar5 = s390_qemu_cpu_model.features[1]._6_2_;
      pTVar12->flags = (undefined4)s390_qemu_cpu_model.features[1];
      uVar8 = s390_qemu_cpu_model.features[2];
      pTVar12->size = uVar4;
      pTVar12->icount = uVar5;
      s390_qemu_cpu_model.features[2]._0_4_ = (undefined4)uVar6;
      s390_qemu_cpu_model.features[2]._4_4_ = SUB84(uVar6,4);
      uVar14 = s390_qemu_cpu_model.features[2]._4_4_;
      pTVar12->cflags = (undefined4)s390_qemu_cpu_model.features[2];
      s390_qemu_cpu_model.features[2] = uVar8;
      uVar6 = s390_qemu_cpu_model.features[4];
      pTVar12->trace_vcpu_dstate = uVar14;
      (pTVar12->tc).ptr = (void *)s390_qemu_cpu_model.features[3];
      (pTVar12->tc).size = uVar6;
      uVar14 = s390_qemu_cpu_model._48_4_;
      uVar15 = s390_qemu_cpu_model.cpu_id;
      uVar16 = s390_qemu_cpu_model._56_4_;
      uVar17 = s390_qemu_cpu_model._60_4_;
    }
    else {
      if (cpu_model != UC_CPU_S390X_MAX) {
        return;
      }
      pCVar1 = uc->cpu;
      if (get_max_cpu_model_cached == '\0') {
        get_max_cpu_model_max_model._0_8_ =
             s390_find_cpu_def(0x2964,'\r','\x02',(unsigned_long *)0x0);
        get_max_cpu_model_max_model._8_8_ = qemu_max_cpu_feat[0];
        get_max_cpu_model_max_model._16_8_ = qemu_max_cpu_feat[1];
        get_max_cpu_model_max_model._24_8_ = qemu_max_cpu_feat[2];
        get_max_cpu_model_max_model._32_8_ = qemu_max_cpu_feat[3];
        get_max_cpu_model_max_model._40_8_ = qemu_max_cpu_feat[4];
        get_max_cpu_model_cached = '\x01';
      }
      pTVar12 = (TranslationBlock *)g_malloc(0x40);
      pCVar1[1].tb_jmp_cache[0x1db] = pTVar12;
      uVar7 = get_max_cpu_model_max_model._8_8_;
      pTVar12->pc = get_max_cpu_model_max_model._0_8_;
      pTVar12->cs_base = uVar7;
      uVar7 = get_max_cpu_model_max_model._24_8_;
      uVar4 = get_max_cpu_model_max_model._20_2_;
      uVar5 = get_max_cpu_model_max_model._22_2_;
      pTVar12->flags = get_max_cpu_model_max_model._16_4_;
      uVar9 = get_max_cpu_model_max_model._24_8_;
      pTVar12->size = uVar4;
      pTVar12->icount = uVar5;
      get_max_cpu_model_max_model._24_4_ = (undefined4)uVar7;
      get_max_cpu_model_max_model._28_4_ = SUB84(uVar7,4);
      uVar14 = get_max_cpu_model_max_model._28_4_;
      pTVar12->cflags = get_max_cpu_model_max_model._24_4_;
      get_max_cpu_model_max_model._24_8_ = uVar9;
      uVar7 = get_max_cpu_model_max_model._40_8_;
      pTVar12->trace_vcpu_dstate = uVar14;
      (pTVar12->tc).ptr = (void *)get_max_cpu_model_max_model._32_8_;
      (pTVar12->tc).size = uVar7;
      uVar14 = get_max_cpu_model_max_model._48_4_;
      uVar15 = get_max_cpu_model_max_model._52_4_;
      uVar16 = get_max_cpu_model_max_model._56_4_;
      uVar17 = get_max_cpu_model_max_model._60_4_;
    }
    *(undefined4 *)&pTVar12->orig_tb = uVar14;
    *(uint32_t *)((long)&pTVar12->orig_tb + 4) = uVar15;
    *(undefined4 *)pTVar12->page_next = uVar16;
    *(undefined4 *)((long)pTVar12->page_next + 4) = uVar17;
  }
  return;
}

Assistant:

void s390_init_cpu_model(uc_engine *uc, uc_cpu_s390x cpu_model)
{
    static const S390FeatInit qemu_latest_init = { S390_FEAT_LIST_QEMU_LATEST };
    int i;

    init_ignored_base_feat();

    /* init all bitmaps from gnerated data initially */
    s390_init_feat_bitmap(qemu_max_cpu_feat_init, qemu_max_cpu_feat);
    for (i = 0; i < ARRAY_SIZE(s390_cpu_defs); i++) {
        s390_init_feat_bitmap(s390_cpu_defs[i].base_init,
                              s390_cpu_defs[i].base_feat);
        s390_init_feat_bitmap(s390_cpu_defs[i].default_init,
                              s390_cpu_defs[i].default_feat);
        s390_init_feat_bitmap(s390_cpu_defs[i].full_init,
                              s390_cpu_defs[i].full_feat);
    }

    /* initialize the qemu model with latest definition */
    s390_set_qemu_cpu_model(QEMU_MAX_CPU_TYPE, QEMU_MAX_CPU_GEN,
                            QEMU_MAX_CPU_EC_GA, qemu_latest_init);

    if (cpu_model < ARRAY_SIZE(s390_cpu_defs)) {
        s390_base_cpu_model_class_init(uc, uc->cpu->cc, (void *) &s390_cpu_defs[cpu_model]);
        s390_cpu_model_class_init(uc, uc->cpu->cc, (void *) &s390_cpu_defs[cpu_model]);
        s390_cpu_model_initfn(uc->cpu);
    } else if (cpu_model == UC_CPU_S390X_MAX) {
        s390_max_cpu_model_class_init(uc, uc->cpu->cc, NULL);
        s390_max_cpu_model_initfn(uc->cpu);
    } else if (cpu_model == UC_CPU_S390X_QEMU) {
        s390_qemu_cpu_model_class_init(uc, uc->cpu->cc, NULL);
        s390_qemu_cpu_model_initfn(uc->cpu);
    }

}